

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoNode.cc
# Opt level: O1

void __thiscall VideoNode::doUi(VideoNode *this)

{
  int iVar1;
  VideoEngine *pVVar2;
  bool bVar3;
  uint uVar4;
  Image screen;
  Image local_30;
  
  bVar3 = ImGui::Combo("Resolution",&this->mode_index,c_mode_names,4,-1);
  if ((bVar3) &&
     (pVVar2 = (this->engine)._M_t.
               super___uniq_ptr_impl<VideoEngine,_std::default_delete<VideoEngine>_>._M_t.
               super__Tuple_impl<0UL,_VideoEngine_*,_std::default_delete<VideoEngine>_>.
               super__Head_base<0UL,_VideoEngine_*,_false>._M_head_impl,
     pVVar2 != (VideoEngine *)0x0)) {
    iVar1 = this->mode_index;
    VideoEngine::setCanvasResolution(pVVar2,c_mode_res[iVar1].w,c_mode_res[iVar1].h);
  }
  local_30.w = 0;
  local_30.h = 0;
  bVar3 = ImGui::Button("Make screensot",(ImVec2 *)&local_30);
  if ((bVar3) &&
     (pVVar2 = (this->engine)._M_t.
               super___uniq_ptr_impl<VideoEngine,_std::default_delete<VideoEngine>_>._M_t.
               super__Tuple_impl<0UL,_VideoEngine_*,_std::default_delete<VideoEngine>_>.
               super__Head_base<0UL,_VideoEngine_*,_false>._M_head_impl,
     pVVar2 != (VideoEngine *)0x0)) {
    VideoEngine::makeScreenshot(&local_30,pVVar2);
    uVar4 = stbi_write_jpg("screenshot.jpg",local_30.w,local_30.h,3,
                           local_30.data.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,0x50);
    aAppDebugPrintf("screenshot written to file %s, result: %d","screenshot.jpg",(ulong)uVar4);
    if (local_30.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30.data.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_30.data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_30.data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void VideoNode::doUi() noexcept {
	if (ImGui::Combo("Resolution", &mode_index, c_mode_names, COUNTOF(c_mode_names))) {
		if (engine)
			engine->setCanvasResolution(c_mode_res[mode_index].w, c_mode_res[mode_index].h);
	}

	if (ImGui::Button("Make screensot") && engine) {
		// TODO filename picker
		// TODO incrementable filenames
		// TODO project-relative

		const char *filename = "screenshot.jpg";
		const Image screen = engine->makeScreenshot();
		const int result = stbi_write_jpg(filename, screen.w, screen.h, 3, screen.data.data(), 80);
		MSG("screenshot written to file %s, result: %d", filename, result);
	}
}